

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O2

void squall::detail::check_argument_type<(squall::detail::FetchContext)0>
               (HSQUIRRELVM vm,SQInteger index,SQObjectType t)

{
  SQObjectType SVar1;
  squirrel_error *this;
  SQObjectType t_00;
  SQObjectType t_01;
  string sStack_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  SVar1 = sq_gettype(vm,index);
  if (SVar1 == t) {
    return;
  }
  this = (squirrel_error *)__cxa_allocate_exception(0x10);
  fetch_context_string<(squall::detail::FetchContext)0>();
  std::operator+(&local_98,&local_b8," must be ");
  get_type_text_abi_cxx11_(&local_d8,(squall *)(ulong)t,t_00);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,", actual value is ");
  get_type_text_abi_cxx11_(&sStack_f8,(squall *)(ulong)SVar1,t_01);
  std::operator+(&local_38,&local_58,&sStack_f8);
  squirrel_error::squirrel_error(this,&local_38);
  __cxa_throw(this,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_argument_type(HSQUIRRELVM vm, SQInteger index, SQObjectType t) {
    SQObjectType at = sq_gettype(vm, index);
    if (at != t) {
        throw squirrel_error(
            fetch_context_string<FC>() + _SC(" must be ") + get_type_text(t) +
            _SC(", actual value is ") + get_type_text(at));
    }
}